

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

DeclaredType * __thiscall slang::ast::Symbol::getDeclaredType(Symbol *this)

{
  bool bVar1;
  TypeAliasType *pTVar2;
  SubroutineSymbol *pSVar3;
  MethodPrototypeSymbol *pMVar4;
  NetType *pNVar5;
  TypeParameterSymbol *pTVar6;
  AssertionPortSymbol *pAVar7;
  RandSeqProductionSymbol *pRVar8;
  CoverpointSymbol *pCVar9;
  ValueSymbol *in_RDI;
  DeclaredType *local_8;
  
  switch((in_RDI->super_Symbol).kind) {
  case TypeAlias:
    pTVar2 = as<slang::ast::TypeAliasType>((Symbol *)0x936965);
    local_8 = &pTVar2->targetType;
    break;
  default:
    bVar1 = isValue((Symbol *)0x936a11);
    if (bVar1) {
      as<slang::ast::ValueSymbol>((Symbol *)0x936a20);
      ValueSymbol::getDeclaredType(in_RDI);
      local_8 = not_null::operator_cast_to_DeclaredType_
                          ((not_null<const_slang::ast::DeclaredType_*> *)0x936a37);
    }
    else {
      local_8 = (DeclaredType *)0x0;
    }
    break;
  case NetType:
    pNVar5 = as<slang::ast::NetType>((Symbol *)0x9369aa);
    local_8 = &pNVar5->declaredType;
    break;
  case TypeParameter:
    pTVar6 = as<slang::ast::TypeParameterSymbol>((Symbol *)0x9369c1);
    local_8 = &pTVar6->targetType;
    break;
  case Subroutine:
    pSVar3 = as<slang::ast::SubroutineSymbol>((Symbol *)0x93697c);
    local_8 = &pSVar3->declaredReturnType;
    break;
  case MethodPrototype:
    pMVar4 = as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x936993);
    local_8 = &pMVar4->declaredReturnType;
    break;
  case AssertionPort:
    pAVar7 = as<slang::ast::AssertionPortSymbol>((Symbol *)0x9369d5);
    local_8 = &pAVar7->declaredType;
    break;
  case RandSeqProduction:
    pRVar8 = as<slang::ast::RandSeqProductionSymbol>((Symbol *)0x9369e9);
    local_8 = &pRVar8->declaredReturnType;
    break;
  case Coverpoint:
    pCVar9 = as<slang::ast::CoverpointSymbol>((Symbol *)0x9369fd);
    local_8 = &pCVar9->declaredType;
  }
  return local_8;
}

Assistant:

const DeclaredType* Symbol::getDeclaredType() const {
    switch (kind) {
        case SymbolKind::TypeAlias:
            return &as<TypeAliasType>().targetType;
        case SymbolKind::Subroutine:
            return &as<SubroutineSymbol>().declaredReturnType;
        case SymbolKind::MethodPrototype:
            return &as<MethodPrototypeSymbol>().declaredReturnType;
        case SymbolKind::NetType:
            return &as<NetType>().declaredType;
        case SymbolKind::TypeParameter:
            return &as<TypeParameterSymbol>().targetType;
        case SymbolKind::AssertionPort:
            return &as<AssertionPortSymbol>().declaredType;
        case SymbolKind::RandSeqProduction:
            return &as<RandSeqProductionSymbol>().declaredReturnType;
        case SymbolKind::Coverpoint:
            return &as<CoverpointSymbol>().declaredType;
        default:
            if (isValue())
                return as<ValueSymbol>().getDeclaredType();
            return nullptr;
    }
}